

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void P_SpawnSkybox(ASkyViewpoint *origin)

{
  line_t_conflict *plVar1;
  uint pnum_00;
  short local_4a;
  uint pnum;
  short i;
  line_t_conflict *refline;
  TVector2<double> local_28;
  sector_t *local_18;
  sector_t *Sector;
  ASkyViewpoint *origin_local;
  
  local_18 = (origin->super_AActor).Sector;
  Sector = (sector_t *)origin;
  if (local_18 == (sector_t *)0x0) {
    Printf("Sector not initialized for SkyCamCompat\n");
    AActor::Pos((DVector3 *)&refline,(AActor *)Sector);
    TVector2<double>::TVector2(&local_28,(TVector3<double> *)&refline);
    local_18 = P_PointInSector(&local_28);
    *(sector_t **)&Sector->validcount = local_18;
  }
  if (local_18 != (sector_t *)0x0) {
    for (local_4a = 0; local_4a < local_18->linecount; local_4a = local_4a + 1) {
      plVar1 = local_18->lines[local_4a];
      if ((plVar1->special == 0x39) && (plVar1->args[1] == 2)) {
        pnum_00 = P_GetSkyboxPortal((ASkyViewpoint *)Sector);
        CopyPortal(plVar1->args[0],plVar1->args[2],pnum_00,0.0,true);
        return;
      }
    }
  }
  return;
}

Assistant:

void P_SpawnSkybox(ASkyViewpoint *origin)
{
	sector_t *Sector = origin->Sector;
	if (Sector == NULL)
	{
		Printf("Sector not initialized for SkyCamCompat\n");
		origin->Sector = Sector = P_PointInSector(origin->Pos());
	}
	if (Sector)
	{
		line_t * refline = NULL;
		for (short i = 0; i < Sector->linecount; i++)
		{
			refline = Sector->lines[i];
			if (refline->special == Sector_SetPortal && refline->args[1] == 2)
			{
				// We found the setup linedef for this skybox, so let's use it for our init.
				unsigned pnum = P_GetSkyboxPortal(origin);
				CopyPortal(refline->args[0], refline->args[2], pnum, 0, true);
				return;
			}
		}
	}
}